

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

null_terminating_iterator<char>
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
          (null_terminating_iterator<char> it,
          width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
          *handler)

{
  basic_string_view<char> id;
  null_terminating_iterator<char> other;
  null_terminating_iterator<char> it_00;
  null_terminating_iterator<char> nVar1;
  char cVar2;
  bool bVar3;
  char *s;
  difference_type value;
  type count;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  *in_RDX;
  char *in_RSI;
  char *in_RDI;
  null_terminating_iterator<char> start;
  uint index;
  char_type c;
  char *in_stack_ffffffffffffff68;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 uVar4;
  char *pcVar5;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  *in_stack_ffffffffffffff98;
  null_terminating_iterator<char> *in_stack_ffffffffffffffa0;
  null_terminating_iterator<char> local_50;
  char *local_40;
  char *local_38;
  uint local_30;
  char local_29;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
  *local_28;
  null_terminating_iterator<char> local_20;
  char *local_10;
  char *local_8;
  
  local_28 = in_RDX;
  local_20.ptr_ = in_RDI;
  local_20.end_ = in_RSI;
  local_29 = null_terminating_iterator<char>::operator*(&local_20);
  if ((local_29 == '}') || (local_29 == ':')) {
    width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
    ::operator()(in_stack_ffffffffffffff70);
    local_10 = local_20.ptr_;
    local_8 = local_20.end_;
  }
  else if ((local_29 < '0') || ('9' < local_29)) {
    bVar3 = is_name_start<char>(local_29);
    if (bVar3) {
      local_40 = local_20.ptr_;
      local_38 = local_20.end_;
      do {
        local_50 = null_terminating_iterator<char>::operator++(&local_20);
        local_29 = null_terminating_iterator<char>::operator*(&local_50);
        bVar3 = is_name_start<char>(local_29);
        if (!bVar3) {
          in_stack_ffffffffffffff7e = '/' < local_29 && local_29 < ':';
        }
        uVar4 = bVar3 || '/' < local_29 && local_29 < ':';
      } while ((bool)uVar4);
      it_00.end_ = local_38;
      it_00.ptr_ = local_40;
      s = pointer_from<char>(it_00);
      other.end_ = local_38;
      other.ptr_ = local_40;
      pcVar5 = local_40;
      value = null_terminating_iterator<char>::operator-(&local_20,other);
      count = to_unsigned<long>(value);
      basic_string_view<char>::basic_string_view
                ((basic_string_view<char> *)&stack0xffffffffffffffa0,s,count);
      id.data_._6_1_ = in_stack_ffffffffffffff7e;
      id.data_._0_6_ = in_stack_ffffffffffffff78;
      id.data_._7_1_ = uVar4;
      id.size_ = (size_t)pcVar5;
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
      ::operator()(local_28,id);
      local_10 = local_20.ptr_;
      local_8 = local_20.end_;
    }
    else {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
      ::on_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_10 = local_20.ptr_;
      local_8 = local_20.end_;
    }
  }
  else {
    local_30 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>&>
                         (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    cVar2 = null_terminating_iterator<char>::operator*(&local_20);
    if ((cVar2 == '}') ||
       (cVar2 = null_terminating_iterator<char>::operator*(&local_20), cVar2 == ':')) {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
      ::operator()(in_stack_ffffffffffffff70,(uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      local_10 = local_20.ptr_;
      local_8 = local_20.end_;
    }
    else {
      width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
      ::on_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_10 = local_20.ptr_;
      local_8 = local_20.end_;
    }
  }
  nVar1.end_ = local_8;
  nVar1.ptr_ = local_10;
  return nVar1;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(pointer_from(start), to_unsigned(it - start)));
  return it;
}